

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  int iVar2;
  uint uVar3;
  Mat *this_00;
  size_t _elemsize;
  void *pvVar4;
  pointer pMVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  void *__src;
  int iVar12;
  int iVar13;
  size_t i;
  ulong uVar14;
  long lVar15;
  void *pvVar16;
  int j;
  int iVar17;
  long lVar18;
  int iVar19;
  int _c;
  size_t i_1;
  int j_1;
  int iVar20;
  long local_d8;
  Mat m;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = this_00->dims;
  _elemsize = this_00->elemsize;
  pvVar4 = (this->slices).data;
  if (uVar7 == 1) {
    iVar2 = this_00->w;
    lVar15 = 0;
    lVar18 = 0;
    uVar14 = 0;
    iVar19 = 0;
    while( true ) {
      pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar5 >> 6;
      if (uVar8 <= uVar14) break;
      iVar12 = *(int *)((long)pvVar4 + uVar14 * 4);
      if (iVar12 == -0xe9) {
        iVar12 = (int)((ulong)((long)iVar2 - (long)iVar19) / (uVar8 + lVar15));
      }
      Mat::create((Mat *)((long)&pMVar5->data + lVar18),iVar12,_elemsize,opt->blob_allocator);
      pvVar16 = *(void **)((long)&pMVar5->data + lVar18);
      if ((pvVar16 == (void *)0x0) ||
         ((long)*(int *)((long)&pMVar5->c + lVar18) * *(long *)((long)&pMVar5->cstep + lVar18) == 0)
         ) {
        return -100;
      }
      memcpy(pvVar16,(void *)(_elemsize * (long)iVar19 + (long)this_00->data),
             (long)iVar12 * _elemsize);
      iVar19 = iVar19 + iVar12;
      uVar14 = uVar14 + 1;
      lVar18 = lVar18 + 0x40;
      lVar15 = lVar15 + -1;
    }
  }
  else {
    uVar3 = this->axis;
    if ((uVar7 ^ 2) == 0 && uVar3 == 0) {
      iVar2 = this_00->w;
      iVar19 = this_00->h;
      lVar18 = 0;
      lVar15 = 0;
      uVar14 = 0;
      iVar12 = 0;
      while( true ) {
        pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar5 >> 6;
        if (uVar8 <= uVar14) break;
        iVar10 = *(int *)((long)pvVar4 + uVar14 * 4);
        if (iVar10 == -0xe9) {
          iVar10 = (int)((ulong)((long)iVar19 - (long)iVar12) / (uVar8 + lVar18));
        }
        Mat::create((Mat *)((long)&pMVar5->data + lVar15),iVar2,iVar10,_elemsize,opt->blob_allocator
                   );
        pvVar16 = *(void **)((long)&pMVar5->data + lVar15);
        if (pvVar16 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar5->c + lVar15) * *(long *)((long)&pMVar5->cstep + lVar15) ==
            0) {
          return -100;
        }
        memcpy(pvVar16,(void *)((long)this_00->w * (long)iVar12 * this_00->elemsize +
                               (long)this_00->data),(long)(iVar10 * iVar2) * _elemsize);
        iVar12 = iVar12 + iVar10;
        uVar14 = uVar14 + 1;
        lVar15 = lVar15 + 0x40;
        lVar18 = lVar18 + -1;
      }
    }
    else if ((uVar7 ^ 2) == 0 && (uVar3 ^ 1) == 0) {
      iVar2 = this_00->h;
      iVar19 = 0;
      if (0 < iVar2) {
        iVar19 = iVar2;
      }
      iVar12 = this_00->w;
      uVar14 = 0;
      iVar10 = 0;
      while( true ) {
        pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar5 >> 6;
        uVar9 = uVar8 - uVar14;
        if (uVar8 < uVar14 || uVar9 == 0) break;
        iVar11 = *(int *)((long)pvVar4 + uVar14 * 4);
        if (iVar11 == -0xe9) {
          iVar11 = (int)((ulong)((long)iVar12 - (long)iVar10) / uVar9);
        }
        pMVar1 = pMVar5 + uVar14;
        Mat::create(pMVar1,iVar11,iVar2,_elemsize,opt->blob_allocator);
        if (pMVar5[uVar14].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        for (iVar17 = 0; iVar19 != iVar17; iVar17 = iVar17 + 1) {
          memcpy((void *)((long)pMVar1->w * (long)iVar17 * pMVar1->elemsize + (long)pMVar1->data),
                 (void *)((long)this_00->data +
                         (long)iVar10 * _elemsize +
                         (long)this_00->w * (long)iVar17 * this_00->elemsize),
                 (long)iVar11 * _elemsize);
        }
        iVar10 = iVar11 + iVar10;
        uVar14 = uVar14 + 1;
      }
    }
    else {
      uVar7 = uVar7 ^ 3;
      if (uVar7 == 0 && uVar3 == 0) {
        iVar2 = this_00->w;
        iVar19 = this_00->h;
        iVar12 = this_00->c;
        local_d8 = 0;
        lVar15 = 0;
        uVar14 = 0;
        iVar10 = 0;
        while( true ) {
          pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 6;
          if (uVar8 <= uVar14) break;
          iVar11 = *(int *)((long)pvVar4 + uVar14 * 4);
          if (iVar11 == -0xe9) {
            iVar11 = (int)((ulong)((long)iVar12 - (long)iVar10) / (uVar8 + local_d8));
          }
          pMVar1 = (Mat *)((long)&pMVar5->data + lVar15);
          Mat::create(pMVar1,iVar2,iVar19,iVar11,_elemsize,opt->blob_allocator);
          if (*(long *)((long)&pMVar5->data + lVar15) == 0) {
            return -100;
          }
          if ((long)*(int *)((long)&pMVar5->c + lVar15) * *(long *)((long)&pMVar5->cstep + lVar15)
              == 0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          Mat::channel(&m,this_00,iVar10);
          pvVar16 = m.data;
          Mat::~Mat(&m);
          memcpy(pMVar1->data,pvVar16,(long)((int)sVar6 * iVar11) * _elemsize);
          iVar10 = iVar11 + iVar10;
          uVar14 = uVar14 + 1;
          lVar15 = lVar15 + 0x40;
          local_d8 = local_d8 + -1;
        }
      }
      else if ((uVar3 ^ 1) == 0 && uVar7 == 0) {
        iVar2 = this_00->w;
        iVar19 = this_00->c;
        iVar12 = this_00->h;
        iVar10 = 0;
        if (0 < iVar19) {
          iVar10 = iVar19;
        }
        iVar11 = 0;
        uVar14 = 0;
        while( true ) {
          pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 6;
          uVar9 = uVar8 - uVar14;
          if (uVar8 < uVar14 || uVar9 == 0) break;
          iVar17 = *(int *)((long)pvVar4 + uVar14 * 4);
          if (iVar17 == -0xe9) {
            iVar17 = (int)((ulong)((long)iVar12 - (long)iVar11) / uVar9);
          }
          pMVar1 = pMVar5 + uVar14;
          Mat::create(pMVar1,iVar2,iVar17,iVar19,_elemsize,opt->blob_allocator);
          if (pMVar5[uVar14].data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          for (iVar13 = 0; iVar10 != iVar13; iVar13 = iVar13 + 1) {
            Mat::channel(&m,pMVar1,iVar13);
            pvVar16 = m.data;
            Mat::~Mat(&m);
            Mat::channel(&m,this_00,iVar13);
            __src = (void *)((long)m.w * (long)iVar11 * m.elemsize + (long)m.data);
            Mat::~Mat(&m);
            memcpy(pvVar16,__src,(long)(iVar17 * iVar2) * _elemsize);
          }
          iVar11 = iVar17 + iVar11;
          uVar14 = uVar14 + 1;
        }
      }
      else {
        if (uVar7 != 0 || uVar3 != 2) {
          return 0;
        }
        iVar2 = this_00->w;
        iVar19 = this_00->h;
        iVar12 = this_00->c;
        iVar10 = 0;
        if (0 < iVar19) {
          iVar10 = iVar19;
        }
        iVar11 = 0;
        if (0 < iVar12) {
          iVar11 = iVar12;
        }
        iVar17 = 0;
        uVar14 = 0;
        while( true ) {
          pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 6;
          uVar9 = uVar8 - uVar14;
          if (uVar8 < uVar14 || uVar9 == 0) break;
          iVar13 = *(int *)((long)pvVar4 + uVar14 * 4);
          if (iVar13 == -0xe9) {
            iVar13 = (int)((ulong)((long)iVar2 - (long)iVar17) / uVar9);
          }
          pMVar1 = pMVar5 + uVar14;
          Mat::create(pMVar1,iVar13,iVar19,iVar12,_elemsize,opt->blob_allocator);
          if (pMVar5[uVar14].data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          for (_c = 0; _c != iVar11; _c = _c + 1) {
            Mat::channel(&m,pMVar1,_c);
            pvVar16 = m.data;
            Mat::~Mat(&m);
            Mat::channel(&m,this_00,_c);
            for (iVar20 = 0; iVar10 != iVar20; iVar20 = iVar20 + 1) {
              memcpy(pvVar16,(void *)((long)m.data +
                                     (long)iVar17 * _elemsize +
                                     (long)iVar20 * (long)m.w * m.elemsize),(long)iVar13 * _elemsize
                    );
              pvVar16 = (void *)((long)pvVar16 + (long)iVar13 * _elemsize);
            }
            Mat::~Mat(&m);
          }
          iVar17 = iVar13 + iVar17;
          uVar14 = uVar14 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;

    if (dims == 1) // axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j=0; j<h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                int size = w * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).row<const unsigned char>(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j=0; j<h; j++)
                {
                    const unsigned char* ptr = m.row<const unsigned char>(j) + q * elemsize;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice * elemsize;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}